

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::js::Generator::FindProvidesForFile
          (Generator *this,GeneratorOptions *options,Printer *printer,FileDescriptor *file,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *provided)

{
  Printer *extraout_RDX;
  Printer *printer_00;
  Printer *extraout_RDX_00;
  long lVar1;
  Generator *this_00;
  long lVar2;
  
  printer_00 = printer;
  this_00 = this;
  if (0 < *(int *)(file + 0x58)) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      this_00 = this;
      FindProvidesForMessage
                (this,options,printer,(Descriptor *)(*(long *)(file + 0x60) + lVar1),provided);
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0xa8;
      printer_00 = extraout_RDX;
    } while (lVar2 < *(int *)(file + 0x58));
  }
  if (0 < *(int *)(file + 0x68)) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      FindProvidesForEnum(this_00,options,printer_00,
                          (EnumDescriptor *)(*(long *)(file + 0x70) + lVar1),provided);
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x38;
      printer_00 = extraout_RDX_00;
    } while (lVar2 < *(int *)(file + 0x68));
  }
  return;
}

Assistant:

void Generator::FindProvidesForFile(const GeneratorOptions& options,
                                    io::Printer* printer,
                                    const FileDescriptor* file,
                                    std::set<string>* provided) const {
  for (int i = 0; i < file->message_type_count(); i++) {
    FindProvidesForMessage(options, printer, file->message_type(i), provided);
  }
  for (int i = 0; i < file->enum_type_count(); i++) {
    FindProvidesForEnum(options, printer, file->enum_type(i), provided);
  }
}